

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caches.cpp
# Opt level: O3

CacheSizes *
node::CalculateCacheSizes(CacheSizes *__return_storage_ptr__,ArgsManager *args,size_t n_indexes)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int64_t iVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  paVar1 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"-dbcache","");
  iVar3 = ArgsManager::GetIntArg(args,&local_58,0x1c2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  uVar6 = 0x400000;
  if (0x400000 < iVar3 * 0x100000) {
    uVar6 = iVar3 * 0x100000;
  }
  if (0x3ffffffff < (long)uVar6) {
    uVar6 = 0x400000000;
  }
  uVar5 = uVar6 >> 3;
  if (0x1fffff < uVar5) {
    uVar5 = 0x200000;
  }
  __return_storage_ptr__->block_tree_db = uVar5;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"-txindex","");
  bVar2 = ArgsManager::GetBoolArg(args,&local_58,false);
  uVar8 = uVar6 - uVar5 >> 3;
  if ((uint)bVar2 << 0x1e < uVar8) {
    uVar8 = (ulong)((uint)bVar2 << 0x1e);
  }
  __return_storage_ptr__->tx_index = uVar8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  lVar7 = (uVar6 - uVar5) - uVar8;
  __return_storage_ptr__->filter_index = 0;
  if (n_indexes != 0) {
    lVar4 = lVar7 + 7;
    if (-1 < lVar7) {
      lVar4 = lVar7;
    }
    uVar6 = lVar4 >> 3;
    if (0x3fffffff < (long)uVar6) {
      uVar6 = 0x40000000;
    }
    __return_storage_ptr__->filter_index = uVar6 / n_indexes;
    lVar7 = lVar7 - (uVar6 / n_indexes) * n_indexes;
  }
  lVar4 = lVar7 + 3;
  if (-1 < lVar7) {
    lVar4 = lVar7;
  }
  lVar4 = (lVar4 >> 2) + 0x800000;
  if (lVar7 / 2 <= lVar4) {
    lVar4 = lVar7 / 2;
  }
  if (0x7fffff < lVar4) {
    lVar4 = 0x800000;
  }
  __return_storage_ptr__->coins_db = lVar4;
  __return_storage_ptr__->coins = lVar7 - lVar4;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CacheSizes CalculateCacheSizes(const ArgsManager& args, size_t n_indexes)
{
    int64_t nTotalCache = (args.GetIntArg("-dbcache", nDefaultDbCache) << 20);
    nTotalCache = std::max(nTotalCache, nMinDbCache << 20); // total cache cannot be less than nMinDbCache
    nTotalCache = std::min(nTotalCache, nMaxDbCache << 20); // total cache cannot be greater than nMaxDbcache
    CacheSizes sizes;
    sizes.block_tree_db = std::min(nTotalCache / 8, nMaxBlockDBCache << 20);
    nTotalCache -= sizes.block_tree_db;
    sizes.tx_index = std::min(nTotalCache / 8, args.GetBoolArg("-txindex", DEFAULT_TXINDEX) ? nMaxTxIndexCache << 20 : 0);
    nTotalCache -= sizes.tx_index;
    sizes.filter_index = 0;
    if (n_indexes > 0) {
        int64_t max_cache = std::min(nTotalCache / 8, max_filter_index_cache << 20);
        sizes.filter_index = max_cache / n_indexes;
        nTotalCache -= sizes.filter_index * n_indexes;
    }
    sizes.coins_db = std::min(nTotalCache / 2, (nTotalCache / 4) + (1 << 23)); // use 25%-50% of the remainder for disk cache
    sizes.coins_db = std::min(sizes.coins_db, nMaxCoinsDBCache << 20); // cap total coins db cache
    nTotalCache -= sizes.coins_db;
    sizes.coins = nTotalCache; // the rest goes to in-memory cache
    return sizes;
}